

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O1

void __thiscall CTcSymLocalBase::finish_ctx_var_conv(CTcSymLocalBase *this)

{
  CTcParser *this_00;
  int iVar1;
  
  if ((*(ushort *)&this->field_0x64 & 0x30) == 0x10) {
    CTcParser::init_local_ctx(G_prs);
    this_00 = G_prs;
    this->ctx_var_num_ = G_prs->local_ctx_var_num_;
    this->field_0x64 = this->field_0x64 | 0x20;
    if (this->ctx_arr_idx_ == 0) {
      iVar1 = CTcParser::alloc_ctx_arr_idx(this_00);
      this->ctx_arr_idx_ = iVar1;
    }
  }
  return;
}

Assistant:

void CTcSymLocalBase::finish_ctx_var_conv()
{
    /* 
     *   If this isn't already marked as a context variable, there's
     *   nothing to do - this variable must not have been referenced from
     *   an anonymous function yet, and hence can be kept in the stack.
     *   
     *   Similarly, if my context local variable number has been assigned
     *   already, there's nothing to do - we must have been set to refer
     *   back to a context variable in an enclosing scope (this can happen
     *   in a nested anonymous function).
     */
    if (!is_ctx_local_ || ctx_var_num_set_)
        return;

    /* 
     *   tell the parser to create a local context for this scope, if it
     *   hasn't already 
     */
    G_prs->init_local_ctx();

    /* use the local context variable specified by the parser */
    ctx_var_num_ = G_prs->get_local_ctx_var();
    ctx_var_num_set_ = TRUE;

    /* assign our array index */
    if (ctx_arr_idx_ == 0)
        ctx_arr_idx_ = G_prs->alloc_ctx_arr_idx();
}